

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Node::Node(Node *this,StringPtr name,Which kind,Reader genericParams)

{
  undefined2 in_register_0000000a;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_00204780;
  (this->declaration)._reader.data = (void *)0x0;
  (this->declaration)._reader.pointers = (WirePointer *)0x0;
  *(undefined8 *)((long)&(this->declaration)._reader.pointers + 6) = 0;
  this->module = (CompiledModule *)0x0;
  (this->parent).ptr = (Node *)0x0;
  (this->declaration)._reader.segment = (SegmentReader *)0x0;
  (this->declaration)._reader.capTable = (CapTableReader *)0x0;
  (this->declaration)._reader.nestingLimit = 0x7fffffff;
  this->id = (ulong)CONCAT22(in_register_0000000a,kind) + 1000;
  (this->displayName).content.ptr = name.content.ptr;
  (this->displayName).content.size_ = name.content.size_;
  this->kind = kind;
  this->genericParamCount = genericParams.reader.elementCount;
  this->isBuiltin = true;
  this->startByte = 0;
  this->endByte = 0;
  Content::Content(&this->guardedContent);
  this->inGetContent = false;
  (this->loadedFinalSchema).ptr.isSet = false;
  return;
}

Assistant:

Compiler::Node::Node(kj::StringPtr name, Declaration::Which kind,
                     List<Declaration::BrandParameter>::Reader genericParams)
    : module(nullptr),
      parent(kj::none),
      // It's helpful if these have unique IDs. Real type IDs can't be under 2^31 anyway.
      id(1000 + static_cast<uint>(kind)),
      displayName(name),
      kind(kind),
      genericParamCount(genericParams.size()),
      isBuiltin(true),
      startByte(0),
      endByte(0) {}